

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

void ast_dump_node(FILE *f,_node_t *n,int indent)

{
  char *pcVar1;
  int in_EDX;
  FILE *in_RSI;
  FILE *in_RDI;
  int ind;
  uint i;
  int in_stack_ffffffffffffffe4;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  if (in_RSI != (FILE *)root) {
    iVar4 = in_EDX;
    fprintf(in_RDI,"; ");
    iVar2 = in_EDX;
    in_EDX = iVar4;
    while (in_stack_ffffffffffffffe4 = iVar2 + -1, iVar2 != 0) {
      fprintf(in_RDI,"    ");
      iVar2 = in_stack_ffffffffffffffe4;
    }
    if (*(node_type_e *)&in_RSI->field_0x4 == STATEMENT_LIST) {
      fprintf(in_RDI,"SCOPE %d\n",(ulong)*(uint *)&in_RSI->_IO_write_base);
    }
    else if (*(node_type_e *)&in_RSI->field_0x4 == FUNCTION) {
      fprintf(in_RDI,"FUNCTION %s\n",(char *)((long)&in_RSI->_IO_write_base + 4));
    }
    else if (*(node_type_e *)&in_RSI->field_0x4 == ASSIGN) {
      fprintf(in_RDI,"assign\n");
    }
    else if (in_RSI->_flags == 0x86) {
      fprintf(in_RDI,"%s\n",(char *)((long)&in_RSI->_IO_write_base + 4));
    }
    else if (in_RSI->_flags == 0x87) {
      fprintf(in_RDI,"%d\n",(ulong)*(uint *)&in_RSI->_IO_write_base);
    }
    else if (in_RSI->_flags == 0x8d) {
      fprintf(in_RDI,"+ve\n");
    }
    else if (in_RSI->_flags == 0x8c) {
      fprintf(in_RDI,"-ve\n");
    }
    else {
      pcVar1 = token_name(in_RSI->_flags);
      fprintf(in_RDI,"%s\n",pcVar1);
    }
  }
  for (uVar3 = 0; uVar3 < *(uint *)&in_RSI->_IO_read_ptr; uVar3 = uVar3 + 1) {
    if (*(long *)(in_RSI->_IO_read_base + (ulong)uVar3 * 8) != 0) {
      ast_dump_node(in_RSI,(_node_t *)CONCAT44(in_EDX,uVar3),in_stack_ffffffffffffffe4);
    }
  }
  return;
}

Assistant:

void ast_dump_node(FILE* f, _node_t* n, int indent)
{
    unsigned int i;
    if (n != root)
    {
        int ind = indent;
        fprintf(f, "; ");
        while (ind--)
            fprintf(f, "    ");

        if (n->type == STATEMENT_LIST)
        {
            fprintf(f, "SCOPE %d\n", n->num_value);
        }
        else if (n->type == FUNCTION)
        {
            fprintf(f, "FUNCTION %s\n", n->identifier);
        }
        else if (n->type == ASSIGN)
        {
            fprintf(f, "assign\n");
        }
        else if (n->id == IDENTIFIER)
        {
            fprintf(f, "%s\n", n->identifier);
        }
        else if (n->id == CONSTANT)
        {
            fprintf(f, "%d\n", n->num_value);
        }
        else if (n->id == POSITIVE)
        {
            fprintf(f, "+ve\n");
        }
        else if (n->id == NEGATIVE)
        {
            fprintf(f, "-ve\n");
        }
        else
            fprintf(f, "%s\n", token_name(n->id));
    }

    for (i = 0; i < n->num_children; i++)
    {
        if (n->children[i])
            ast_dump_node(f, n->children[i], indent + 1);
    }
}